

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

void ImGui::RenderTextEllipsis
               (ImDrawList *draw_list,ImVec2 *pos_min,ImVec2 *pos_max,float clip_max_x,
               float ellipsis_max_x,char *text,char *text_end_full,ImVec2 *text_size_if_known)

{
  float size;
  ImFont *this;
  undefined4 uVar1;
  undefined4 uVar2;
  char *text_end;
  ImDrawList *pIVar3;
  ImVec2 *pIVar4;
  ImDrawList *draw_list_00;
  char *in_text;
  int iVar5;
  ImU32 col;
  ImFontGlyph *pIVar6;
  int iVar7;
  ImGuiContext *g;
  ImGuiContext *pIVar8;
  char *text_display_end;
  uint uVar9;
  ImVec2 IVar10;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined8 extraout_XMM0_Qb_00;
  undefined8 extraout_XMM0_Qb_01;
  float fVar13;
  ImWchar local_c2;
  float local_c0;
  char *text_end_ellipsis;
  float local_ac;
  ImVec2 local_a8;
  float local_9c;
  ImVec4 local_98;
  ImVec2 local_88;
  undefined8 uStack_80;
  ImDrawList *local_78;
  ImVec2 *local_70;
  char *local_68;
  ImVec2 local_60;
  ImGuiContext *local_58;
  ImVec2 *local_50;
  float local_48;
  undefined8 extraout_XMM0_Qb;
  
  pIVar8 = GImGui;
  if (text_end_full == (char *)0x0) {
    text_end_full = text;
    if (text != (char *)0xffffffffffffffff) {
      do {
        if (*text_end_full == '#') {
          if (text_end_full[1] == '#') goto LAB_001dfe54;
        }
        else if (*text_end_full == '\0') goto LAB_001dfe54;
        text_end_full = text_end_full + 1;
      } while (text_end_full != (char *)0xffffffffffffffff);
    }
    text_end_full = (char *)0xffffffffffffffff;
  }
LAB_001dfe54:
  local_ac = clip_max_x;
  local_48 = ellipsis_max_x;
  if (text_size_if_known == (ImVec2 *)0x0) {
    if (text_end_full == text) {
      local_60 = (ImVec2)((ulong)(uint)GImGui->FontSize << 0x20);
    }
    else {
      auVar11._0_8_ =
           ImFont::CalcTextSizeA
                     (GImGui->Font,GImGui->FontSize,3.4028235e+38,0.0,text,text_end_full,
                      (char **)0x0);
      auVar11._8_8_ = extraout_XMM0_Qb;
      auVar12._4_12_ = auVar11._4_12_;
      auVar12._0_4_ = (float)(int)(auVar11._0_4_ + 0.99999);
      local_60 = auVar12._0_8_;
    }
  }
  else {
    local_60 = *text_size_if_known;
  }
  if (local_60.x <= pos_max->x - pos_min->x) {
    local_98.y = pos_max->y;
    local_98.x = local_ac;
    text_end_ellipsis = (char *)0x0;
    RenderTextClippedEx(draw_list,pos_min,(ImVec2 *)&local_98,text,text_end_full,&local_60,
                        (ImVec2 *)&text_end_ellipsis,(ImRect *)0x0);
  }
  else {
    local_58 = pIVar8;
    this = draw_list->_Data->Font;
    size = draw_list->_Data->FontSize;
    text_end_ellipsis = (char *)0x0;
    local_c2 = this->EllipsisChar;
    local_78 = draw_list;
    local_70 = pos_max;
    local_68 = text;
    if (local_c2 == 0xffff) {
      local_c2 = this->DotChar;
      pIVar6 = ImFont::FindGlyph(this,local_c2);
      local_9c = draw_list->_Data->FontSize / this->FontSize;
      local_c0 = (pIVar6->X1 - pIVar6->X0) + local_9c;
      local_9c = local_c0 * 3.0 - local_9c;
      iVar7 = 3;
    }
    else {
      pIVar6 = ImFont::FindGlyph(this,local_c2);
      local_9c = pIVar6->X1;
      iVar7 = 1;
      local_c0 = local_9c;
    }
    in_text = local_68;
    uVar9 = -(uint)(local_48 <= local_70->x);
    fVar13 = ((float)(~uVar9 & (uint)local_48 | (uint)local_70->x & uVar9) - local_9c) - pos_min->x;
    if (fVar13 <= 1.0) {
      fVar13 = 1.0;
    }
    local_50 = pos_min;
    local_88 = ImFont::CalcTextSizeA(this,size,fVar13,0.0,local_68,text_end_full,&text_end_ellipsis)
    ;
    uStack_80 = extraout_XMM0_Qb_00;
    text_end = text_end_ellipsis;
    pIVar3 = local_78;
    pIVar4 = local_50;
    if (text_end_ellipsis < text_end_full && text_end_ellipsis == in_text) {
      iVar5 = ImTextCharFromUtf8((uint *)&local_98,in_text,text_end_full);
      text_end_ellipsis = in_text + iVar5;
      local_88 = ImFont::CalcTextSizeA
                           (this,size,3.4028235e+38,0.0,in_text,text_end_ellipsis,(char **)0x0);
      uStack_80 = extraout_XMM0_Qb_01;
      text_end = text_end_ellipsis;
      pIVar3 = local_78;
      pIVar4 = local_50;
    }
    while ((pos_min = local_50, draw_list_00 = local_78, local_78 = pIVar3, local_50 = pIVar4,
           in_text < text_end && ((text_end[-1] == ' ' || (text_end[-1] == '\t'))))) {
      text_end_ellipsis = text_end + -1;
      IVar10 = ImFont::CalcTextSizeA
                         (this,size,3.4028235e+38,0.0,text_end_ellipsis,text_end,(char **)0x0);
      local_88.x = local_88.x - IVar10.x;
      text_end = text_end_ellipsis;
      pIVar3 = local_78;
      pIVar4 = local_50;
      local_50 = pos_min;
      local_78 = draw_list_00;
    }
    local_98.y = local_70->y;
    local_98.x = local_ac;
    local_a8.x = 0.0;
    local_a8.y = 0.0;
    text_end_ellipsis = text_end;
    RenderTextClippedEx(draw_list_00,pos_min,(ImVec2 *)&local_98,in_text,text_end,&local_60,
                        &local_a8,(ImRect *)0x0);
    fVar13 = local_88.x + pos_min->x;
    text = local_68;
    pIVar8 = local_58;
    if (local_9c + fVar13 <= local_48) {
      do {
        local_88.x = fVar13;
        local_a8.y = pos_min->y;
        local_a8.x = fVar13;
        local_98.x = (GImGui->Style).Colors[0].x;
        local_98.y = (GImGui->Style).Colors[0].y;
        uVar1 = (GImGui->Style).Colors[0].z;
        uVar2 = (GImGui->Style).Colors[0].w;
        local_98.w = (GImGui->Style).Alpha * (float)uVar2;
        local_98.z = (float)uVar1;
        col = ColorConvertFloat4ToU32(&local_98);
        ImFont::RenderChar(this,draw_list_00,size,&local_a8,col,local_c2);
        fVar13 = local_88.x + local_c0;
        iVar7 = iVar7 + -1;
        text = local_68;
        pIVar8 = local_58;
      } while (iVar7 != 0);
    }
  }
  if (pIVar8->LogEnabled == true) {
    LogRenderedText(pos_min,text,text_end_full);
  }
  return;
}

Assistant:

void ImGui::RenderTextEllipsis(ImDrawList* draw_list, const ImVec2& pos_min, const ImVec2& pos_max, float clip_max_x, float ellipsis_max_x, const char* text, const char* text_end_full, const ImVec2* text_size_if_known)
{
    ImGuiContext& g = *GImGui;
    if (text_end_full == NULL)
        text_end_full = FindRenderedTextEnd(text);
    const ImVec2 text_size = text_size_if_known ? *text_size_if_known : CalcTextSize(text, text_end_full, false, 0.0f);

    //draw_list->AddLine(ImVec2(pos_max.x, pos_min.y - 4), ImVec2(pos_max.x, pos_max.y + 4), IM_COL32(0, 0, 255, 255));
    //draw_list->AddLine(ImVec2(ellipsis_max_x, pos_min.y-2), ImVec2(ellipsis_max_x, pos_max.y+2), IM_COL32(0, 255, 0, 255));
    //draw_list->AddLine(ImVec2(clip_max_x, pos_min.y), ImVec2(clip_max_x, pos_max.y), IM_COL32(255, 0, 0, 255));
    // FIXME: We could technically remove (last_glyph->AdvanceX - last_glyph->X1) from text_size.x here and save a few pixels.
    if (text_size.x > pos_max.x - pos_min.x)
    {
        // Hello wo...
        // |       |   |
        // min   max   ellipsis_max
        //          <-> this is generally some padding value

        const ImFont* font = draw_list->_Data->Font;
        const float font_size = draw_list->_Data->FontSize;
        const char* text_end_ellipsis = NULL;

        ImWchar ellipsis_char = font->EllipsisChar;
        int ellipsis_char_count = 1;
        if (ellipsis_char == (ImWchar)-1)
        {
            ellipsis_char = font->DotChar;
            ellipsis_char_count = 3;
        }
        const ImFontGlyph* glyph = font->FindGlyph(ellipsis_char);

        float ellipsis_glyph_width = glyph->X1;                 // Width of the glyph with no padding on either side
        float ellipsis_total_width = ellipsis_glyph_width;      // Full width of entire ellipsis

        if (ellipsis_char_count > 1)
        {
            // Full ellipsis size without free spacing after it.
            const float spacing_between_dots = 1.0f * (draw_list->_Data->FontSize / font->FontSize);
            ellipsis_glyph_width = glyph->X1 - glyph->X0 + spacing_between_dots;
            ellipsis_total_width = ellipsis_glyph_width * (float)ellipsis_char_count - spacing_between_dots;
        }

        // We can now claim the space between pos_max.x and ellipsis_max.x
        const float text_avail_width = ImMax((ImMax(pos_max.x, ellipsis_max_x) - ellipsis_total_width) - pos_min.x, 1.0f);
        float text_size_clipped_x = font->CalcTextSizeA(font_size, text_avail_width, 0.0f, text, text_end_full, &text_end_ellipsis).x;
        if (text == text_end_ellipsis && text_end_ellipsis < text_end_full)
        {
            // Always display at least 1 character if there's no room for character + ellipsis
            text_end_ellipsis = text + ImTextCountUtf8BytesFromChar(text, text_end_full);
            text_size_clipped_x = font->CalcTextSizeA(font_size, FLT_MAX, 0.0f, text, text_end_ellipsis).x;
        }
        while (text_end_ellipsis > text && ImCharIsBlankA(text_end_ellipsis[-1]))
        {
            // Trim trailing space before ellipsis (FIXME: Supporting non-ascii blanks would be nice, for this we need a function to backtrack in UTF-8 text)
            text_end_ellipsis--;
            text_size_clipped_x -= font->CalcTextSizeA(font_size, FLT_MAX, 0.0f, text_end_ellipsis, text_end_ellipsis + 1).x; // Ascii blanks are always 1 byte
        }

        // Render text, render ellipsis
        RenderTextClippedEx(draw_list, pos_min, ImVec2(clip_max_x, pos_max.y), text, text_end_ellipsis, &text_size, ImVec2(0.0f, 0.0f));
        float ellipsis_x = pos_min.x + text_size_clipped_x;
        if (ellipsis_x + ellipsis_total_width <= ellipsis_max_x)
            for (int i = 0; i < ellipsis_char_count; i++)
            {
                font->RenderChar(draw_list, font_size, ImVec2(ellipsis_x, pos_min.y), GetColorU32(ImGuiCol_Text), ellipsis_char);
                ellipsis_x += ellipsis_glyph_width;
            }
    }
    else
    {
        RenderTextClippedEx(draw_list, pos_min, ImVec2(clip_max_x, pos_max.y), text, text_end_full, &text_size, ImVec2(0.0f, 0.0f));
    }

    if (g.LogEnabled)
        LogRenderedText(&pos_min, text, text_end_full);
}